

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::DoubleQuoteHexLow
          (AbstractContentContext *this,double inWordSpacing,double inCharacterSpacing,
          string *inText)

{
  EStatusCode EVar1;
  PrimitiveObjectsWriter *this_00;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *inText_local;
  double inCharacterSpacing_local;
  double inWordSpacing_local;
  AbstractContentContext *this_local;
  
  local_28 = inText;
  inText_local = (string *)inCharacterSpacing;
  inCharacterSpacing_local = inWordSpacing;
  inWordSpacing_local = (double)this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  AssertProcsetAvailable(this,&KProcsetText_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteDouble(this_00,inCharacterSpacing_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,(double)inText_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteHexString(this_00,local_28,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\"",&local_49);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::DoubleQuoteHexLow(double inWordSpacing, double inCharacterSpacing, const std::string& inText)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);
	AssertProcsetAvailable(KProcsetText);

	mPrimitiveWriter.WriteDouble(inWordSpacing);
	mPrimitiveWriter.WriteDouble(inCharacterSpacing);
	mPrimitiveWriter.WriteHexString(inText);
	mPrimitiveWriter.WriteKeyword("\"");
	return GetCurrentStatusCode();
}